

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_header_procedure
                   (opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  undefined8 p_event_mgr;
  OPJ_BOOL OVar1;
  uint uVar2;
  opj_jp2_header_handler_t *poVar3;
  ulong uVar4;
  OPJ_OFF_T OVar5;
  OPJ_BYTE *pOVar6;
  OPJ_SIZE_T OVar7;
  OPJ_BYTE *new_current_data;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_current_data_size;
  OPJ_UINT32 l_last_data_size;
  opj_jp2_header_handler_t *l_current_handler_misplaced;
  opj_jp2_header_handler_t *l_current_handler;
  OPJ_UINT32 l_nb_bytes_read;
  opj_jp2_box_t box;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *stream_local;
  opj_jp2_t *jp2_local;
  
  l_current_data._4_4_ = 0x400;
  box._4_8_ = p_manager;
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8df,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8e0,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8e1,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  new_current_data = (OPJ_BYTE *)opj_calloc(1,0x400);
  if (new_current_data == (OPJ_BYTE *)0x0) {
    opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                  "Not enough memory to handle jpeg2000 file header\n");
  }
  else {
    do {
      while( true ) {
        while( true ) {
          OVar1 = opj_jp2_read_boxhdr((opj_jp2_box_t *)((long)&l_current_handler + 4),
                                      (OPJ_UINT32 *)&l_current_handler,stream,
                                      (opj_event_mgr_t *)box._4_8_);
          if (OVar1 == 0) {
            opj_free(new_current_data);
            return 1;
          }
          if (l_nb_bytes_read == 0x6a703263) {
            if ((jp2->jp2_state & 4) != 0) {
              jp2->jp2_state = jp2->jp2_state | 8;
              opj_free(new_current_data);
              return 1;
            }
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,"bad placed jpeg codestream\n");
            opj_free(new_current_data);
            return 0;
          }
          if (l_current_handler._4_4_ == 0) {
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,"Cannot handle box of undefined sizes\n");
            opj_free(new_current_data);
            return 0;
          }
          if (l_current_handler._4_4_ < (uint)l_current_handler) {
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,"invalid box size %d (%x)\n",
                          (ulong)l_current_handler._4_4_,(ulong)l_nb_bytes_read);
            opj_free(new_current_data);
            return 0;
          }
          l_current_handler_misplaced = opj_jp2_find_handler(l_nb_bytes_read);
          poVar3 = opj_jp2_img_find_handler(l_nb_bytes_read);
          uVar2 = l_current_handler._4_4_ - (uint)l_current_handler;
          if ((l_current_handler_misplaced != (opj_jp2_header_handler_t *)0x0) ||
             (poVar3 != (opj_jp2_header_handler_t *)0x0)) break;
          if ((jp2->jp2_state & 1) == 0) {
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                          "Malformed JP2 file format: first box must be JPEG 2000 signature box\n");
            opj_free(new_current_data);
            return 0;
          }
          if ((jp2->jp2_state & 2) == 0) {
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                          "Malformed JP2 file format: second box must be file type box\n");
            opj_free(new_current_data);
            return 0;
          }
          jp2->jp2_state = jp2->jp2_state | 0x7fffffff;
          uVar4 = opj_stream_skip(stream,(ulong)uVar2,(opj_event_mgr_t *)box._4_8_);
          if (uVar4 != uVar2) {
            if ((jp2->jp2_state & 8) != 0) {
              opj_event_msg((opj_event_mgr_t *)box._4_8_,2,
                            "Problem with skipping JPEG2000 box, stream error\n");
              opj_free(new_current_data);
              return 1;
            }
            opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                          "Problem with skipping JPEG2000 box, stream error\n");
            opj_free(new_current_data);
            return 0;
          }
        }
        if ((l_current_handler_misplaced != (opj_jp2_header_handler_t *)0x0) ||
           (opj_event_msg((opj_event_mgr_t *)box._4_8_,2,
                          "Found a misplaced \'%c%c%c%c\' box outside jp2h box\n",
                          (ulong)(l_nb_bytes_read >> 0x18),(ulong)(l_nb_bytes_read >> 0x10 & 0xff),
                          (ulong)(l_nb_bytes_read >> 8 & 0xff),l_nb_bytes_read & 0xff),
           l_current_handler_misplaced = poVar3, (jp2->jp2_state & 4) != 0)) break;
        opj_event_msg((opj_event_mgr_t *)box._4_8_,2,
                      "JPEG2000 Header box not read yet, \'%c%c%c%c\' box will be ignored\n",
                      (ulong)(l_nb_bytes_read >> 0x18),(ulong)(l_nb_bytes_read >> 0x10 & 0xff),
                      (ulong)(l_nb_bytes_read >> 8 & 0xff),l_nb_bytes_read & 0xff);
        jp2->jp2_state = jp2->jp2_state | 0x7fffffff;
        uVar4 = opj_stream_skip(stream,(ulong)uVar2,(opj_event_mgr_t *)box._4_8_);
        if (uVar4 != uVar2) {
          opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                        "Problem with skipping JPEG2000 box, stream error\n");
          opj_free(new_current_data);
          return 0;
        }
      }
      OVar5 = opj_stream_get_number_byte_left(stream);
      p_event_mgr = box._4_8_;
      if (OVar5 < (long)(ulong)uVar2) {
        OVar5 = opj_stream_get_number_byte_left(stream);
        opj_event_msg((opj_event_mgr_t *)p_event_mgr,1,
                      "Invalid box size %d for box \'%c%c%c%c\'. Need %d bytes, %d bytes remaining \n"
                      ,(ulong)l_current_handler._4_4_,(ulong)(l_nb_bytes_read >> 0x18),
                      (ulong)(l_nb_bytes_read >> 0x10 & 0xff),l_nb_bytes_read >> 8 & 0xff,
                      l_nb_bytes_read & 0xff,uVar2,(int)OVar5);
        opj_free(new_current_data);
        return 0;
      }
      pOVar6 = new_current_data;
      if ((l_current_data._4_4_ < uVar2) &&
         (pOVar6 = (OPJ_BYTE *)opj_realloc(new_current_data,(ulong)uVar2),
         l_current_data._4_4_ = uVar2, pOVar6 == (OPJ_BYTE *)0x0)) {
        opj_free(new_current_data);
        opj_event_msg((opj_event_mgr_t *)box._4_8_,1,"Not enough memory to handle jpeg2000 box\n");
        return 0;
      }
      new_current_data = pOVar6;
      OVar7 = opj_stream_read_data
                        (stream,new_current_data,(ulong)uVar2,(opj_event_mgr_t *)box._4_8_);
      l_current_handler._0_4_ = (uint)OVar7;
      if ((uint)l_current_handler != uVar2) {
        opj_event_msg((opj_event_mgr_t *)box._4_8_,1,
                      "Problem with reading JPEG2000 box, stream error\n");
        opj_free(new_current_data);
        return 0;
      }
      OVar1 = (*l_current_handler_misplaced->handler)
                        (jp2,new_current_data,uVar2,(opj_event_mgr_t *)box._4_8_);
    } while (OVar1 != 0);
    opj_free(new_current_data);
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *jp2,
        opj_stream_private_t *stream,
        opj_event_mgr_t * p_manager
                                             )
{
    opj_jp2_box_t box;
    OPJ_UINT32 l_nb_bytes_read;
    const opj_jp2_header_handler_t * l_current_handler;
    const opj_jp2_header_handler_t * l_current_handler_misplaced;
    OPJ_UINT32 l_last_data_size = OPJ_BOX_SIZE;
    OPJ_UINT32 l_current_data_size;
    OPJ_BYTE * l_current_data = 00;

    /* preconditions */
    assert(stream != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    l_current_data = (OPJ_BYTE*)opj_calloc(1, l_last_data_size);

    if (l_current_data == 00) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory to handle jpeg2000 file header\n");
        return OPJ_FALSE;
    }

    while (opj_jp2_read_boxhdr(&box, &l_nb_bytes_read, stream, p_manager)) {
        /* is it the codestream box ? */
        if (box.type == JP2_JP2C) {
            if (jp2->jp2_state & JP2_STATE_HEADER) {
                jp2->jp2_state |= JP2_STATE_CODESTREAM;
                opj_free(l_current_data);
                return OPJ_TRUE;
            } else {
                opj_event_msg(p_manager, EVT_ERROR, "bad placed jpeg codestream\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        } else if (box.length == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "Cannot handle box of undefined sizes\n");
            opj_free(l_current_data);
            return OPJ_FALSE;
        }
        /* testcase 1851.pdf.SIGSEGV.ce9.948 */
        else if (box.length < l_nb_bytes_read) {
            opj_event_msg(p_manager, EVT_ERROR, "invalid box size %d (%x)\n", box.length,
                          box.type);
            opj_free(l_current_data);
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_find_handler(box.type);
        l_current_handler_misplaced = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_nb_bytes_read;

        if ((l_current_handler != 00) || (l_current_handler_misplaced != 00)) {
            if (l_current_handler == 00) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Found a misplaced '%c%c%c%c' box outside jp2h box\n",
                              (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                              (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0));
                if (jp2->jp2_state & JP2_STATE_HEADER) {
                    /* read anyway, we already have jp2h */
                    l_current_handler = l_current_handler_misplaced;
                } else {
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "JPEG2000 Header box not read yet, '%c%c%c%c' box will be ignored\n",
                                  (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                                  (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0));
                    jp2->jp2_state |= JP2_STATE_UNKNOWN;
                    if (opj_stream_skip(stream, l_current_data_size,
                                        p_manager) != l_current_data_size) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Problem with skipping JPEG2000 box, stream error\n");
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                    }
                    continue;
                }
            }
            if ((OPJ_OFF_T)l_current_data_size > opj_stream_get_number_byte_left(stream)) {
                /* do not even try to malloc if we can't read */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid box size %d for box '%c%c%c%c'. Need %d bytes, %d bytes remaining \n",
                              box.length, (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                              (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0), l_current_data_size,
                              (OPJ_UINT32)opj_stream_get_number_byte_left(stream));
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            if (l_current_data_size > l_last_data_size) {
                OPJ_BYTE* new_current_data = (OPJ_BYTE*)opj_realloc(l_current_data,
                                             l_current_data_size);
                if (!new_current_data) {
                    opj_free(l_current_data);
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Not enough memory to handle jpeg2000 box\n");
                    return OPJ_FALSE;
                }
                l_current_data = new_current_data;
                l_last_data_size = l_current_data_size;
            }

            l_nb_bytes_read = (OPJ_UINT32)opj_stream_read_data(stream, l_current_data,
                              l_current_data_size, p_manager);
            if (l_nb_bytes_read != l_current_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Problem with reading JPEG2000 box, stream error\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }

            if (! l_current_handler->handler(jp2, l_current_data, l_current_data_size,
                                             p_manager)) {
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        } else {
            if (!(jp2->jp2_state & JP2_STATE_SIGNATURE)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Malformed JP2 file format: first box must be JPEG 2000 signature box\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            if (!(jp2->jp2_state & JP2_STATE_FILE_TYPE)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Malformed JP2 file format: second box must be file type box\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            jp2->jp2_state |= JP2_STATE_UNKNOWN;
            if (opj_stream_skip(stream, l_current_data_size,
                                p_manager) != l_current_data_size) {
                if (jp2->jp2_state & JP2_STATE_CODESTREAM) {
                    /* If we already read the codestream, do not error out */
                    /* Needed for data/input/nonregression/issue254.jp2 */
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "Problem with skipping JPEG2000 box, stream error\n");
                    opj_free(l_current_data);
                    return OPJ_TRUE;
                } else {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Problem with skipping JPEG2000 box, stream error\n");
                    opj_free(l_current_data);
                    return OPJ_FALSE;
                }
            }
        }
    }

    opj_free(l_current_data);

    return OPJ_TRUE;
}